

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68851_p000(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *__format;
  uint in_EDI;
  
  uVar1 = dasm_read_imm_16(in_EDI);
  pcVar3 = get_ea_mode_str(g_cpu_ir,2);
  if ((uVar1 & 0xfde0) == 0x2000) {
    if ((uVar1 >> 9 & 1) == 0) {
      sprintf(g_dasm_str,"pload   %s, #%d",pcVar3,0);
      return;
    }
    pcVar6 = "pload   #%d, %s";
    uVar5 = 0;
    goto LAB_002ff5f8;
  }
  if ((uVar1 & 0xe200) == 0x2000) {
    sprintf(g_dasm_str,"pflushr %x, %x, %s",(ulong)(uVar1 & 0x1f),(ulong)(uVar1 >> 5 & 0xf),pcVar3);
    return;
  }
  if ((short)uVar1 == 0x2800) {
    pcVar6 = "pvalid  VAL, %s";
    goto LAB_002ff64f;
  }
  if ((uVar1 & 0xffff) != 0xa000) {
    if ((uVar1 & 0xfff8) == 0x2c00) {
      uVar1 = uVar1 & 7;
      pcVar6 = "pvalid  A%d, %s";
    }
    else {
      if ((uVar1 & 0xe000) != 0x8000) {
        uVar2 = uVar1 >> 0xd;
        if (uVar2 == 0) {
LAB_002ff6bb:
          pcVar6 = *(char **)((long)g_mmuregs + (ulong)(uVar1 >> 7 & 0x38));
          if ((uVar1 >> 8 & 1) == 0) {
            __format = "pmove   %s, %s";
          }
          else {
            __format = "pmovefd %s, %s";
          }
          pcVar4 = pcVar3;
          if ((uVar1 >> 9 & 1) == 0) {
            pcVar4 = pcVar6;
            pcVar6 = pcVar3;
          }
          sprintf(g_dasm_str,__format,pcVar6,pcVar4);
          return;
        }
        if (uVar2 == 3) {
          if ((uVar1 >> 9 & 1) == 0) {
            pcVar6 = "pmove   %s, mmusr";
          }
          else {
            pcVar6 = "pmove   mmusr, %s";
          }
          goto LAB_002ff64f;
        }
        if (uVar2 == 2) goto LAB_002ff6bb;
        goto LAB_002ff631;
      }
      uVar1 = uVar1 & 0x1f;
      pcVar6 = "ptest  #%d, %s";
    }
    uVar5 = (ulong)uVar1;
LAB_002ff5f8:
    sprintf(g_dasm_str,pcVar6,uVar5,pcVar3);
    return;
  }
  sprintf(g_dasm_str,"pflushr %s",pcVar3);
LAB_002ff631:
  pcVar6 = "pmove   [unknown form], %s";
LAB_002ff64f:
  sprintf(g_dasm_str,pcVar6,pcVar3);
  return;
}

Assistant:

static void d68851_p000(void)
{
	char* str;
	uint modes = read_imm_16();

	// do this after fetching the second PMOVE word so we properly get the 3rd if necessary
	str = get_ea_mode_str_32(g_cpu_ir);

	if ((modes & 0xfde0) == 0x2000)	// PLOAD
	{
		if (modes & 0x0200)
		{
	 		sprintf(g_dasm_str, "pload   #%d, %s", (modes>>10)&7, str);
		}
		else
		{
	 		sprintf(g_dasm_str, "pload   %s, #%d", str, (modes>>10)&7);
		}
		return;
	}

	if ((modes & 0xe200) == 0x2000)	// PFLUSH
	{
		sprintf(g_dasm_str, "pflushr %x, %x, %s", modes & 0x1f, (modes>>5)&0xf, str);
		return;
	}

	if (modes == 0xa000)	// PFLUSHR
	{
		sprintf(g_dasm_str, "pflushr %s", str);
	}

	if (modes == 0x2800)	// PVALID (FORMAT 1)
	{
		sprintf(g_dasm_str, "pvalid  VAL, %s", str);
		return;
	}

	if ((modes & 0xfff8) == 0x2c00)	// PVALID (FORMAT 2)
	{
		sprintf(g_dasm_str, "pvalid  A%d, %s", modes & 0xf, str);
		return;
	}

	if ((modes & 0xe000) == 0x8000)	// PTEST
	{
		sprintf(g_dasm_str, "ptest  #%d, %s", modes & 0x1f, str);
		return;
	}

	switch ((modes>>13) & 0x7)
	{
		case 0:	// MC68030/040 form with FD bit
		case 2:	// MC68881 form, FD never set
			if (modes & 0x0100)
			{
				if (modes & 0x0200)
				{
			 		sprintf(g_dasm_str, "pmovefd %s, %s", g_mmuregs[(modes>>10)&7], str);
				}
				else
				{
			 		sprintf(g_dasm_str, "pmovefd %s, %s", str, g_mmuregs[(modes>>10)&7]);
				}
			}
			else
			{
				if (modes & 0x0200)
				{
			 		sprintf(g_dasm_str, "pmove   %s, %s", g_mmuregs[(modes>>10)&7], str);
				}
				else
				{
			 		sprintf(g_dasm_str, "pmove   %s, %s", str, g_mmuregs[(modes>>10)&7]);
				}
			}
			break;

		case 3:	// MC68030 to/from status reg
			if (modes & 0x0200)
			{
		 		sprintf(g_dasm_str, "pmove   mmusr, %s", str);
			}
			else
			{
		 		sprintf(g_dasm_str, "pmove   %s, mmusr", str);
			}
			break;

		default:
			sprintf(g_dasm_str, "pmove   [unknown form], %s", str);
			break;
	}
}